

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

void stbi__hdr_convert(float *output,stbi_uc *input,int req_comp)

{
  int in_EDX;
  byte *in_RSI;
  float *in_RDI;
  float fVar1;
  double dVar2;
  float f1;
  
  if (in_RSI[3] == 0) {
    switch(in_EDX) {
    case 2:
      in_RDI[1] = 1.0;
    case 1:
      *in_RDI = 0.0;
      break;
    case 4:
      in_RDI[3] = 1.0;
    case 3:
      in_RDI[2] = 0.0;
      in_RDI[1] = 0.0;
      *in_RDI = 0.0;
    }
  }
  else {
    dVar2 = std::ldexp(5.26354424712089e-315,in_RSI[3] - 0x88);
    fVar1 = SUB84(dVar2,0);
    if (in_EDX < 3) {
      *in_RDI = ((float)((uint)*in_RSI + (uint)in_RSI[1] + (uint)in_RSI[2]) * fVar1) / 3.0;
    }
    else {
      *in_RDI = (float)*in_RSI * fVar1;
      in_RDI[1] = (float)in_RSI[1] * fVar1;
      in_RDI[2] = (float)in_RSI[2] * fVar1;
    }
    if (in_EDX == 2) {
      in_RDI[1] = 1.0;
    }
    if (in_EDX == 4) {
      in_RDI[3] = 1.0;
    }
  }
  return;
}

Assistant:

static void stbi__hdr_convert(float *output, stbi_uc *input, int req_comp)
{
   if ( input[3] != 0 ) {
      float f1;
      // Exponent
      f1 = (float) ldexp(1.0f, input[3] - (int)(128 + 8));
      if (req_comp <= 2)
         output[0] = (input[0] + input[1] + input[2]) * f1 / 3;
      else {
         output[0] = input[0] * f1;
         output[1] = input[1] * f1;
         output[2] = input[2] * f1;
      }
      if (req_comp == 2) output[1] = 1;
      if (req_comp == 4) output[3] = 1;
   } else {
      switch (req_comp) {
         case 4: output[3] = 1; /* fallthrough */
         case 3: output[0] = output[1] = output[2] = 0;
                 break;
         case 2: output[1] = 1; /* fallthrough */
         case 1: output[0] = 0;
                 break;
      }
   }
}